

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                 (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
                 PredictionData<double,_long> *prediction_data,
                 vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
                 ImputedData<long,_long_double> *imputed_data,double curr_weight,size_t row,
                 long *tree_num,double *tree_depth,size_t curr_lev)

{
  int iVar1;
  pointer pvVar2;
  bool bVar3;
  uint uVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  PredictionData<double,_long> *in_RCX;
  IsoForest *in_RDX;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RSI;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RDI;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_R8;
  double in_R9;
  undefined1 uVar8;
  ImputedData<long,_long_double> *in_XMM0_Qa;
  double dVar9;
  double dVar10;
  long *unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  ImputedData<long,_long_double> *in_stack_00000018;
  long *row_end;
  long *row_st;
  NumericConfig numeric_config;
  double range_penalty;
  int cval;
  double xval;
  size_t in_stack_fffffffffffffbc8;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_fffffffffffffbd0;
  ImputedData<long,_long_double> *in_stack_fffffffffffffbd8;
  long *in_stack_fffffffffffffbe0;
  PredictionData<double,_long> *in_stack_fffffffffffffbe8;
  ImputedData<long,_long_double> *in_stack_fffffffffffffc90;
  ImputedData<long,_long_double> *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  ImputedData<long,_long_double> *local_358;
  int local_34c;
  ImputedData<long,_long_double> *local_298;
  ImputedData<long,_long_double> *local_288;
  ImputedData<long,_long_double> *local_280;
  ImputedData<long,_long_double> *local_270;
  long local_1b0;
  ImputedData<long,_long_double> *local_1a0;
  bool local_179;
  ImputedData<long,_long_double> *local_178;
  double local_58;
  double in_stack_ffffffffffffffb8;
  double dVar11;
  double dVar12;
  
  local_58 = 0.0;
  if (in_RDX[1].trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    if (*(long *)&in_RDX->has_range_penalty == 0) {
      uVar8 = (in_RDX->new_cat_action & 1) != Weighted;
    }
    else {
      uVar8 = 3;
    }
  }
  else {
    uVar8 = 2;
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              while( true ) {
                pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                   (in_RDI,(size_type)in_stack_00000018);
                if (pvVar5->tree_left == 0) {
                  if (in_stack_00000008 != (double *)0x0) {
                    in_stack_00000008[(long)in_R9] = (double)in_stack_00000018;
                  }
                  if (in_stack_00000010 != (double *)0x0) {
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    *in_stack_00000010 = pvVar5->score;
                  }
                  if (in_R8 != (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0) {
                    std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                              ((vector<ImputeNode,_std::allocator<ImputeNode>_> *)in_RCX,
                               (size_type)in_stack_00000018);
                    add_from_impute_node<ImputedData<long,long_double>>
                              ((ImputeNode *)
                               CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                               in_stack_fffffffffffffc98,(double)in_stack_fffffffffffffc90);
                  }
                  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                     (in_RDI,(size_type)in_stack_00000018);
                  return pvVar5->score - local_58;
                }
                pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                   (in_RDI,(size_type)in_stack_00000018);
                if (pvVar5->col_type != Numeric) break;
                switch(uVar8) {
                case 0:
                  pvVar2 = (in_RDX->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                     (in_RDI,(size_type)in_stack_00000018);
                  in_stack_ffffffffffffffb8 =
                       *(double *)
                        ((long)&(pvVar2->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                _M_impl +
                        (pvVar5->col_num + (long)in_R9 * *(long *)&in_RDX->missing_action) * 8);
                  break;
                case 1:
                  pvVar2 = (in_RDX->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  dVar11 = in_R9;
                  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                     (in_RDI,(size_type)in_stack_00000018);
                  in_stack_ffffffffffffffb8 =
                       *(double *)
                        ((long)&(pvVar2->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                _M_impl +
                        ((long)in_R9 +
                        pvVar5->col_num *
                        (long)(in_RDX->trees).
                              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8);
                  in_R9 = dVar11;
                  break;
                case 2:
                  std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            (in_RDI,(size_type)in_stack_00000018);
                  in_stack_ffffffffffffffb8 =
                       extract_spR<PredictionData<double,long>,long>
                                 (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                                  (long *)in_stack_fffffffffffffbd8,
                                  (size_t)in_stack_fffffffffffffbd0);
                  break;
                case 3:
                  std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                            (in_RDI,(size_type)in_stack_00000018);
                  in_stack_ffffffffffffffb8 =
                       extract_spC<PredictionData<double,long>>
                                 ((PredictionData<double,_long> *)in_stack_fffffffffffffbd8,
                                  (size_t)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
                }
                uVar4 = std::isnan(in_stack_ffffffffffffffb8);
                if ((uVar4 & 1) == 0) {
                  dVar11 = in_stack_ffffffffffffffb8;
                  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                     (in_RDI,(size_type)in_stack_00000018);
                  local_179 = true;
                  dVar12 = dVar11;
                  if (pvVar5->range_low <= in_stack_ffffffffffffffb8) {
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    local_179 = pvVar5->range_high <= dVar11 && dVar11 != pvVar5->range_high;
                  }
                  local_58 = (double)local_179 + local_58;
                  in_stack_ffffffffffffffb8 = dVar12;
                  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                     (in_RDI,(size_type)in_stack_00000018);
                  if (pvVar5->num_split < dVar12) {
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    local_1a0 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
                  }
                  else {
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    local_1a0 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
                  }
                  in_stack_00000018 = local_1a0;
                }
                else {
                  iVar1 = *(int *)&in_RSI[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                                   _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1 == 0) {
                    return NAN;
                  }
                  if (iVar1 == 0x15) {
                    if ((in_stack_00000008 != (double *)0x0) || (in_stack_00000010 != (double *)0x0)
                       ) {
                      throw_unsupported_pred_error();
                    }
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    dVar11 = pvVar5->pct_tree_left;
                    std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                              (in_RDI,(size_type)in_stack_00000018);
                    std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                              (in_RDI,(size_type)in_stack_00000018);
                    dVar9 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                                      (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,
                                       (size_t)in_stack_ffffffffffffffb8,unaff_retaddr,
                                       in_stack_00000008,(size_t)in_stack_00000010);
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    dVar12 = pvVar5->pct_tree_left;
                    std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                              (in_RDI,(size_type)in_stack_00000018);
                    std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                              (in_RDI,(size_type)in_stack_00000018);
                    dVar10 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                                       (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,
                                        (size_t)in_stack_ffffffffffffffb8,unaff_retaddr,
                                        in_stack_00000008,(size_t)in_stack_00000010);
                    return (dVar11 * dVar9 + (1.0 - dVar12) * dVar10) - local_58;
                  }
                  if (iVar1 == 0x16) {
                    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                       (in_RDI,(size_type)in_stack_00000018);
                    if (pvVar5->pct_tree_left < 0.5) {
                      pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                         (in_RDI,(size_type)in_stack_00000018);
                      local_178 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
                    }
                    else {
                      pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                         (in_RDI,(size_type)in_stack_00000018);
                      local_178 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
                    }
                    in_stack_00000018 = local_178;
                  }
                }
              }
            } while (pvVar5->col_type != Categorical);
            pvVar2 = (in_RDX->trees).
                     super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((in_RDX->new_cat_action & 1) == Weighted) {
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              local_1b0 = pvVar5->col_num + (long)in_R9 * (long)in_RDX->exp_avg_depth;
            }
            else {
              dVar11 = in_R9;
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              local_1b0 = (long)in_R9 +
                          pvVar5->col_num *
                          (long)(in_RDX->trees).
                                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
              in_R9 = dVar11;
            }
            local_34c = *(int *)((long)&(pvVar2->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl.super__Vector_impl_data._M_start + local_1b0 * 4);
            if (-1 < local_34c) break;
            iVar1 = *(int *)&in_RSI[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl
                             .super__Vector_impl_data._M_finish;
            if (iVar1 == 0) {
              return NAN;
            }
            if (iVar1 == 0x15) {
              if ((in_stack_00000008 != (double *)0x0) || (in_stack_00000010 != (double *)0x0)) {
                throw_unsupported_pred_error();
              }
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              dVar11 = pvVar5->pct_tree_left;
              std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                        (in_RDI,(size_type)in_stack_00000018);
              std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                        (in_RDI,(size_type)in_stack_00000018);
              dVar9 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                                (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,
                                 (size_t)in_stack_ffffffffffffffb8,unaff_retaddr,in_stack_00000008,
                                 (size_t)in_stack_00000010);
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              dVar12 = pvVar5->pct_tree_left;
              std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                        (in_RDI,(size_type)in_stack_00000018);
              std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                        (in_RDI,(size_type)in_stack_00000018);
              dVar10 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                                 (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,
                                  (size_t)in_stack_ffffffffffffffb8,unaff_retaddr,in_stack_00000008,
                                  (size_t)in_stack_00000010);
              return (dVar11 * dVar9 + (1.0 - dVar12) * dVar10) - local_58;
            }
            if (iVar1 == 0x16) {
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              if (pvVar5->pct_tree_left < 0.5) {
                pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                   (in_RDI,(size_type)in_stack_00000018);
                local_270 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
              }
              else {
                pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                   (in_RDI,(size_type)in_stack_00000018);
                local_270 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
              }
              in_stack_00000018 = local_270;
            }
          }
          iVar1 = *(int *)((long)&in_RSI[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4);
          if (iVar1 == 0) break;
          if (iVar1 == 0x29) {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            if (local_34c == pvVar5->chosen_cat) {
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              local_280 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
            }
            else {
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              local_280 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
            }
            in_stack_00000018 = local_280;
          }
        }
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                  (in_RDI,(size_type)in_stack_00000018);
        bVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::empty
                          (in_stack_fffffffffffffbd0);
        if (!bVar3) break;
        if (local_34c < 2) {
          if (local_34c == 0) {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            local_288 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
          }
          else {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            local_288 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
          }
          in_stack_00000018 = local_288;
        }
        else {
          iVar1 = *(int *)&in_RSI[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                           super__Vector_impl_data._M_start;
          if (iVar1 == 0) {
            if ((in_stack_00000008 != (double *)0x0) || (in_stack_00000010 != (double *)0x0)) {
              throw_unsupported_pred_error();
            }
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            dVar11 = pvVar5->pct_tree_left;
            std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                      (in_RDI,(size_type)in_stack_00000018);
            std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                      (in_RDI,(size_type)in_stack_00000018);
            dVar9 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                              (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,
                               (size_t)in_stack_ffffffffffffffb8,unaff_retaddr,in_stack_00000008,
                               (size_t)in_stack_00000010);
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            dVar12 = pvVar5->pct_tree_left;
            std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                      (in_RDI,(size_type)in_stack_00000018);
            std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                      (in_RDI,(size_type)in_stack_00000018);
            dVar10 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                               (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,
                                (size_t)in_stack_ffffffffffffffb8,unaff_retaddr,in_stack_00000008,
                                (size_t)in_stack_00000010);
            return (dVar11 * dVar9 + (1.0 - dVar12) * dVar10) - local_58;
          }
          if (iVar1 == 0xb) {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            if (0.5 < pvVar5->pct_tree_left || pvVar5->pct_tree_left == 0.5) {
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              local_298 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
            }
            else {
              pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                                 (in_RDI,(size_type)in_stack_00000018);
              local_298 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
            }
            in_stack_00000018 = local_298;
          }
        }
      }
      iVar1 = *(int *)&in_RSI[1].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                       super__Vector_impl_data._M_start;
      if (iVar1 == 0) break;
      if (iVar1 == 0xb) {
        in_stack_fffffffffffffca4 = local_34c;
        pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)in_stack_00000018);
        sVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar5->cat_split);
        if (in_stack_fffffffffffffca4 < (int)sVar6) {
          pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)in_stack_00000018);
          pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             (&pvVar5->cat_split,(long)local_34c);
          if (*pvVar7 == '\0') {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            in_stack_00000018 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
            in_stack_fffffffffffffc90 = in_stack_00000018;
          }
          else {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            in_stack_00000018 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
            in_stack_fffffffffffffc90 = in_stack_00000018;
          }
        }
        else {
          pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)in_stack_00000018);
          if (0.5 < pvVar5->pct_tree_left || pvVar5->pct_tree_left == 0.5) {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            in_stack_00000018 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
            in_stack_fffffffffffffc98 = in_stack_00000018;
          }
          else {
            pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                               (in_RDI,(size_type)in_stack_00000018);
            in_stack_00000018 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
            in_stack_fffffffffffffc98 = in_stack_00000018;
          }
        }
      }
      else if (iVar1 == 0xc) {
        pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)in_stack_00000018);
        sVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar5->cat_split);
        if ((int)sVar6 <= local_34c) {
          pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)in_stack_00000018);
          sVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar5->cat_split);
          local_34c = local_34c % (int)sVar6;
        }
        pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                           (in_RDI,(size_type)in_stack_00000018);
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&pvVar5->cat_split,(long)local_34c);
        if (*pvVar7 == '\0') {
          pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)in_stack_00000018);
          local_358 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
        }
        else {
          pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                             (in_RDI,(size_type)in_stack_00000018);
          local_358 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
        }
        in_stack_00000018 = local_358;
      }
    }
    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                       (in_RDI,(size_type)in_stack_00000018);
    sVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&pvVar5->cat_split);
    if ((int)sVar6 <= local_34c) break;
    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                       (in_RDI,(size_type)in_stack_00000018);
    pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&pvVar5->cat_split,(long)local_34c);
    if (*pvVar7 == -1) break;
    pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                       (in_RDI,(size_type)in_stack_00000018);
    pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&pvVar5->cat_split,(long)local_34c);
    if (*pvVar7 == '\0') {
      pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         (in_RDI,(size_type)in_stack_00000018);
      in_stack_00000018 = (ImputedData<long,_long_double> *)pvVar5->tree_right;
      in_stack_fffffffffffffbd8 = in_stack_00000018;
    }
    else {
      pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                         (in_RDI,(size_type)in_stack_00000018);
      in_stack_00000018 = (ImputedData<long,_long_double> *)pvVar5->tree_left;
      in_stack_fffffffffffffbd8 = in_stack_00000018;
    }
  }
  if ((in_stack_00000008 != (double *)0x0) || (in_stack_00000010 != (double *)0x0)) {
    throw_unsupported_pred_error();
  }
  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                     (in_RDI,(size_type)in_stack_00000018);
  dVar11 = pvVar5->pct_tree_left;
  std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)in_stack_00000018);
  std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)in_stack_00000018);
  dVar9 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                    (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,(size_t)in_stack_ffffffffffffffb8,
                     unaff_retaddr,in_stack_00000008,(size_t)in_stack_00000010);
  pvVar5 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[]
                     (in_RDI,(size_type)in_stack_00000018);
  dVar12 = pvVar5->pct_tree_left;
  std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)in_stack_00000018);
  std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,(size_type)in_stack_00000018);
  dVar10 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,long_double>>
                     (in_RSI,in_RDX,in_RCX,in_R8,in_XMM0_Qa,in_R9,(size_t)in_stack_ffffffffffffffb8,
                      unaff_retaddr,in_stack_00000008,(size_t)in_stack_00000010);
  return (dVar11 * dVar9 + (1.0 - dVar12) * dVar10) - local_58;
}

Assistant:

double traverse_itree(std::vector<IsoTree>     &tree,
                      IsoForest                &model_outputs,
                      PredictionData           &prediction_data,
                      std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                      ImputedData             *imputed_data,     /* only when imputing missing */
                      double                   curr_weight,      /* only when imputing missing */
                      size_t                   row,
                      sparse_ix *restrict      tree_num,
                      double *restrict         tree_depth,
                      size_t                   curr_lev)
{
    double xval;
    int    cval;
    double range_penalty = 0;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
    }

    while (true)
    {
        // if (tree[curr_lev].score >= 0.)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            if (unlikely(imputed_data != NULL))
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, curr_weight);

            return tree[curr_lev].score - range_penalty;
        }

        else
        {
            switch(tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    switch(numeric_config)
                    {
                        case DenseRowMajor:
                        {
                            xval = prediction_data.numeric_data[tree[curr_lev].col_num + row * prediction_data.ncols_numeric];
                            break;
                        }

                        case DenseColMajor:
                        {
                            xval = prediction_data.numeric_data[row +  tree[curr_lev].col_num * prediction_data.nrows];
                            break;
                        }

                        case SparseCSR:
                        {
                            xval = extract_spR(prediction_data, row_st, row_end, tree[curr_lev].col_num);
                            break;
                        }

                        case SparseCSC:
                        {
                            xval = extract_spC(prediction_data, row, tree[curr_lev].col_num);
                            break;
                        }
                    }

                    if (unlikely(std::isnan(xval)))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        range_penalty += (xval < tree[curr_lev].range_low) || (xval > tree[curr_lev].range_high);
                        curr_lev = (xval <= tree[curr_lev].num_split)?
                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    }
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    if (unlikely(cval < 0))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        switch(model_outputs.cat_split_type)
                        {
                            case SingleCateg:
                            {
                                curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case SubSet:
                            {

                                if (tree[curr_lev].cat_split.empty())
                                {
                                    if (cval <= 1)
                                    {
                                        curr_lev = (cval == 0)?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                    }

                                    else
                                    {
                                        switch(model_outputs.new_cat_action)
                                        {
                                            case Smallest:
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                                break;
                                            }

                                            case Weighted:
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            default:
                                            {
                                                assert(0);
                                                break;
                                            }
                                        }
                                    }
                                }

                                else
                                {
                                    switch(model_outputs.new_cat_action)
                                    {
                                        case Random:
                                        {
                                            cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                    (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            break;
                                        }

                                        case Smallest:
                                        {
                                            if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }

                                        case Weighted:
                                        {
                                            if (cval >= (int)tree[curr_lev].cat_split.size()
                                                    ||
                                                tree[curr_lev].cat_split[cval] == (-1))
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }
                                    }
                                }
                                break;
                            }
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}